

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d734c9::AV1FwdTxfm2d_RunFwdAccuracyCheck_Test::TestBody
          (AV1FwdTxfm2d_RunFwdAccuracyCheck_Test *this)

{
  int iVar1;
  int iVar2;
  int32_t *piVar3;
  double *pdVar4;
  undefined8 *puVar5;
  uint32_t uVar6;
  uint uVar7;
  pointer *__ptr;
  SEARCH_METHODS *pSVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  double actual_max_error;
  AssertionResult gtest_ar;
  double avg_abs_error;
  ACMRandom rnd;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  internal local_68 [8];
  undefined8 *local_60;
  double local_58;
  Random local_4c;
  ulong local_48;
  double *local_40;
  AssertHelper local_38;
  
  local_4c.state_ = 0xbaba;
  local_58 = 0.0;
  if (0 < (this->super_AV1FwdTxfm2d).count_) {
    local_40 = &(this->super_AV1FwdTxfm2d).max_error_;
    uVar9 = 0;
    do {
      if (0 < (this->super_AV1FwdTxfm2d).txfm2d_size_) {
        lVar11 = 0;
        do {
          uVar6 = testing::internal::Random::Generate(&local_4c,0x80000000);
          uVar7 = uVar6 >> 0xf & 0x3ff;
          (this->super_AV1FwdTxfm2d).input_[lVar11] = (int16_t)uVar7;
          (this->super_AV1FwdTxfm2d).ref_input_[lVar11] = (double)uVar7;
          (this->super_AV1FwdTxfm2d).output_[lVar11] = 0;
          (this->super_AV1FwdTxfm2d).ref_output_[lVar11] = 0.0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < (this->super_AV1FwdTxfm2d).txfm2d_size_);
      }
      (*(this->super_AV1FwdTxfm2d).fwd_txfm_)
                ((this->super_AV1FwdTxfm2d).input_,(this->super_AV1FwdTxfm2d).output_,
                 (this->super_AV1FwdTxfm2d).tx_width_,(this->super_AV1FwdTxfm2d).tx_type_,10);
      iVar1 = (this->super_AV1FwdTxfm2d).ud_flip_;
      iVar2 = (this->super_AV1FwdTxfm2d).lr_flip_;
      local_48 = uVar9;
      if (iVar1 == 0 || iVar2 == 0) {
        if (iVar2 == 0) {
          if (iVar1 != 0) {
            iVar1 = (this->super_AV1FwdTxfm2d).tx_width_;
            libaom_test::flipud<double>
                      ((this->super_AV1FwdTxfm2d).ref_input_,iVar1,
                       (this->super_AV1FwdTxfm2d).tx_height_,iVar1);
          }
        }
        else {
          iVar1 = (this->super_AV1FwdTxfm2d).tx_width_;
          libaom_test::fliplr<double>
                    ((this->super_AV1FwdTxfm2d).ref_input_,iVar1,
                     (this->super_AV1FwdTxfm2d).tx_height_,iVar1);
        }
      }
      else {
        iVar1 = (this->super_AV1FwdTxfm2d).tx_width_;
        libaom_test::fliplrud<double>
                  ((this->super_AV1FwdTxfm2d).ref_input_,iVar1,(this->super_AV1FwdTxfm2d).tx_height_
                   ,iVar1);
      }
      libaom_test::reference_hybrid_2d
                ((this->super_AV1FwdTxfm2d).ref_input_,(this->super_AV1FwdTxfm2d).ref_output_,
                 (this->super_AV1FwdTxfm2d).tx_type_,(this->super_AV1FwdTxfm2d).tx_size_);
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      lVar11 = (long)(this->super_AV1FwdTxfm2d).txfm2d_size_;
      if (0 < lVar11) {
        piVar3 = (this->super_AV1FwdTxfm2d).output_;
        pdVar4 = (this->super_AV1FwdTxfm2d).ref_output_;
        lVar10 = 0;
        do {
          dVar12 = ::round(pdVar4[lVar10]);
          pdVar4[lVar10] = dVar12;
          pbVar13 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ABS((double)piVar3[lVar10] - dVar12) /
                    (this->super_AV1FwdTxfm2d).amplify_factor_);
          if ((double)local_70._M_head_impl <= (double)pbVar13) {
            local_70._M_head_impl = pbVar13;
          }
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      pdVar4 = local_40;
      testing::internal::CmpHelperGE<double,double>
                (local_68,"max_error_","actual_max_error",local_40,(double *)&local_70);
      if (local_68[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   "tx_w: ",6);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   (this->super_AV1FwdTxfm2d).tx_width_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   " tx_h: ",7);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   (this->super_AV1FwdTxfm2d).tx_height_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   ", tx_type = ",0xc);
        std::ostream::operator<<
                  ((void *)(CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 0x10),
                   (uint)(this->super_AV1FwdTxfm2d).tx_type_);
        pSVar8 = "";
        if (local_60 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*local_60;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                   ,0x66,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((long *)CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_78.data_._1_7_,(TX_TYPE)local_78.data_) + 8))();
        }
      }
      puVar5 = local_60;
      if (local_60 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_60 != local_60 + 2) {
          operator_delete((undefined8 *)*local_60);
        }
        operator_delete(puVar5);
      }
      if (*pdVar4 <= (double)local_70._M_head_impl && (double)local_70._M_head_impl != *pdVar4)
      break;
      iVar1 = (this->super_AV1FwdTxfm2d).txfm2d_size_;
      if ((long)iVar1 < 1) {
        dVar12 = 0.0;
      }
      else {
        dVar12 = 0.0;
        lVar11 = 0;
        do {
          dVar12 = dVar12 + ABS((double)(this->super_AV1FwdTxfm2d).output_[lVar11] -
                                (this->super_AV1FwdTxfm2d).ref_output_[lVar11]);
          lVar11 = lVar11 + 1;
        } while (iVar1 != lVar11);
      }
      local_58 = dVar12 / (double)iVar1 + local_58;
      uVar7 = (int)local_48 + 1;
      uVar9 = (ulong)uVar7;
    } while ((int)uVar7 < (this->super_AV1FwdTxfm2d).count_);
  }
  local_58 = (local_58 / (this->super_AV1FwdTxfm2d).amplify_factor_) /
             (double)(this->super_AV1FwdTxfm2d).count_;
  testing::internal::CmpHelperGE<double,double>
            (local_68,"max_avg_error_","avg_abs_error",&(this->super_AV1FwdTxfm2d).max_avg_error_,
             &local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_70._M_head_impl + 0x10),"tx_size = ",10);
    local_78.data_._0_1_ = (this->super_AV1FwdTxfm2d).tx_size_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_70._M_head_impl + 0x10),(char *)&local_78,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_70._M_head_impl + 0x10),", tx_type = ",0xc);
    local_78.data_._0_1_ = (this->super_AV1FwdTxfm2d).tx_type_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_70._M_head_impl + 0x10),(char *)&local_78,1);
    if (local_60 == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = (SEARCH_METHODS *)*local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
               ,0x73,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  if (local_60 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_60 != local_60 + 2) {
      operator_delete((undefined8 *)*local_60);
    }
    operator_delete(local_60);
  }
  return;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }